

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

double ImGui::RoundScalarWithFormatT<double,double>(char *format,ImGuiDataType data_type,double v)

{
  int in_ESI;
  char *in_RDI;
  char *in_XMM0_Qa;
  char *p;
  char v_str [64];
  char *fmt_start;
  char *local_70;
  char local_68 [64];
  char *local_28;
  char *local_20;
  int local_14;
  char *local_8;
  
  local_20 = in_XMM0_Qa;
  local_14 = in_ESI;
  local_28 = ImParseFormatFindStart(in_RDI);
  if ((*local_28 == '%') && (local_28[1] != '%')) {
    ImFormatString(local_20,(size_t)local_68,(char *)0x40,local_28);
    for (local_70 = local_68; *local_70 == ' '; local_70 = local_70 + 1) {
    }
    if ((local_14 == 8) || (local_14 == 9)) {
      local_20 = (char *)ImAtof((char *)0x22eeb6);
    }
    else {
      ImAtoi<double>(local_70,(double *)&local_20);
    }
    local_8 = local_20;
  }
  else {
    local_8 = local_20;
  }
  return (double)local_8;
}

Assistant:

TYPE ImGui::RoundScalarWithFormatT(const char* format, ImGuiDataType data_type, TYPE v)
{
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        v = (TYPE)ImAtof(p);
    else
        ImAtoi(p, (SIGNEDTYPE*)&v);
    return v;
}